

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O2

string * __thiscall
ser::FieldsTable::ToString_abi_cxx11_(string *__return_storage_ptr__,FieldsTable *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  ostringstream ss;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"FieldsTable [\n");
  for (p_Var2 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->data_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)local_1a8,"    ");
    DataFieldInfo::ToString_abi_cxx11_(&local_1c8,(DataFieldInfo *)(p_Var2 + 2));
    poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  std::operator<<((ostream *)local_1a8,"]\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldsTable::ToString() const
{
    std::ostringstream ss;
    ss << "FieldsTable [\n";
    for (std::map<std::string, DataFieldInfo>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        ss << "    " << iter->second.ToString() << "\n";
    }
    ss << "]\n";
    return ss.str();
}